

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

vector<cfd::js::api::FundAmountMapDataStruct,_std::allocator<cfd::js::api::FundAmountMapDataStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::FundAmountMapData,_cfd::js::api::FundAmountMapDataStruct>::
ConvertToStruct(vector<cfd::js::api::FundAmountMapDataStruct,_std::allocator<cfd::js::api::FundAmountMapDataStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::FundAmountMapData,_cfd::js::api::FundAmountMapDataStruct>
               *this)

{
  pointer pFVar1;
  pointer this_00;
  FundAmountMapDataStruct data;
  FundAmountMapDataStruct FStack_98;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::FundAmountMapDataStruct,_std::allocator<cfd::js::api::FundAmountMapDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::FundAmountMapDataStruct,_std::allocator<cfd::js::api::FundAmountMapDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::FundAmountMapDataStruct,_std::allocator<cfd::js::api::FundAmountMapDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pFVar1 = (this->super_JsonVector<cfd::js::api::json::FundAmountMapData>).
           super_vector<cfd::js::api::json::FundAmountMapData,_std::allocator<cfd::js::api::json::FundAmountMapData>_>
           .
           super__Vector_base<cfd::js::api::json::FundAmountMapData,_std::allocator<cfd::js::api::json::FundAmountMapData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_JsonVector<cfd::js::api::json::FundAmountMapData>).
                 super_vector<cfd::js::api::json::FundAmountMapData,_std::allocator<cfd::js::api::json::FundAmountMapData>_>
                 .
                 super__Vector_base<cfd::js::api::json::FundAmountMapData,_std::allocator<cfd::js::api::json::FundAmountMapData>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pFVar1; this_00 = this_00 + 1
      ) {
    js::api::json::FundAmountMapData::ConvertToStruct(&FStack_98,this_00);
    std::
    vector<cfd::js::api::FundAmountMapDataStruct,_std::allocator<cfd::js::api::FundAmountMapDataStruct>_>
    ::push_back(__return_storage_ptr__,&FStack_98);
    js::api::FundAmountMapDataStruct::~FundAmountMapDataStruct(&FStack_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }